

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O3

void display_rip(int how,char *kilbuf,char *pbuf,long umoney)

{
  nh_menuitem *pnVar1;
  valuable_data *pvVar2;
  short sVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  _func_void_nh_menuitem_ptr_int_nh_bool_char_ptr_int_char_ptr_int_int *p_Var10;
  boolean bVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  char *pcVar16;
  val_list *pvVar17;
  char *pcVar18;
  ulong uVar19;
  obj *poVar20;
  valuable_data *pvVar21;
  dungeon *pdVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  monst *mtmp;
  int *piVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  menulist menu;
  char outrip_buf [256];
  long lVar32;
  
  iVar9 = program_state.stopprint;
  program_state.stopprint = 0;
  init_menulist(&menu);
  if (program_state.game_running == 0) {
    program_state.stopprint = 1;
  }
  else {
    (*windowprocs.win_pause)(P_MESSAGE);
    if ((how < 0xc) && (flags.tombstone != '\0')) {
      if (killer_format == 0) {
LAB_00195b41:
        strcpy(outrip_buf,killed_by_prefix[how]);
        pcVar16 = an(killer);
      }
      else {
        if (killer_format != 1) {
          if (killer_format == 2) {
            strcpy(outrip_buf,killer);
            goto LAB_00195b7d;
          }
          warning("bad killer format?");
          goto LAB_00195b41;
        }
        strcpy(outrip_buf,killed_by_prefix[how]);
        pcVar16 = killer;
      }
      strcat(outrip_buf,pcVar16);
    }
  }
LAB_00195b7d:
  if ((u.uhave._0_1_ & 1) == 0) {
    if (how == 0xf) {
      bVar11 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      if (bVar11 == '\0') {
        poVar20 = carrying(0xd8);
        if (poVar20 != (obj *)0x0) {
          sVar15 = strlen(kilbuf);
          builtin_strncpy(kilbuf + sVar15," (with a fake Amulet)",0x16);
        }
      }
      else {
        sVar15 = strlen(kilbuf);
        builtin_strncpy(kilbuf + sVar15," (in celestial disgrace)",0x19);
      }
    }
  }
  else {
    sVar15 = strlen(kilbuf);
    builtin_strncpy(kilbuf + sVar15," (with the Amulet)",0x13);
  }
  if (program_state.stopprint == 0) {
    pcVar16 = Goodbye();
    sprintf(pbuf,"%s %s the %s...",pcVar16,plname);
    lVar23 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    lVar23 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
    }
    lVar23 = (long)menu.icount;
    menu.items[lVar23].accel = '\0';
    menu.items[lVar23].group_accel = '\0';
    menu.items[lVar23].selected = '\0';
    menu.items[lVar23].caption[0] = '\0';
    menu.items[lVar23].id = 0;
    menu.items[lVar23].role = MI_TEXT;
    menu.icount = menu.icount + 1;
  }
  auVar8 = _DAT_002aba20;
  auVar7 = _DAT_002aba10;
  if (how - 0xfU < 3) {
    pvVar17 = valuables;
    pvVar21 = gems;
    do {
      iVar13 = pvVar17->size;
      if (0 < (long)iVar13) {
        lVar23 = (long)iVar13 + -1;
        auVar30._8_4_ = (int)lVar23;
        auVar30._0_8_ = lVar23;
        auVar30._12_4_ = (int)((ulong)lVar23 >> 0x20);
        auVar30 = auVar30 ^ auVar8;
        lVar23 = 0;
        auVar31 = auVar7;
        do {
          auVar33 = auVar31 ^ auVar8;
          if ((bool)(~(auVar30._4_4_ < auVar33._4_4_ ||
                      auVar30._0_4_ < auVar33._0_4_ && auVar33._4_4_ == auVar30._4_4_) & 1)) {
            *(undefined8 *)((long)&pvVar21->count + lVar23) = 0;
          }
          if (auVar33._12_4_ <= auVar30._12_4_ &&
              (auVar33._8_4_ <= auVar30._8_4_ || auVar33._12_4_ != auVar30._12_4_)) {
            *(undefined8 *)((long)&pvVar21[1].count + lVar23) = 0;
          }
          lVar32 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 2;
          auVar31._8_8_ = lVar32 + 2;
          lVar23 = lVar23 + 0x20;
        } while ((ulong)(iVar13 + 1U >> 1) << 5 != lVar23);
      }
      pvVar21 = pvVar17[1].list;
      pvVar17 = pvVar17 + 1;
    } while (pvVar21 != (valuable_data *)0x0);
    get_valuables(invent);
    pvVar17 = valuables;
    pvVar21 = gems;
    iVar13 = u.urscore;
    do {
      if (0 < (long)pvVar17->size) {
        lVar23 = 0;
        do {
          lVar32 = *(long *)((long)&pvVar21->count + lVar23);
          if (lVar32 != 0) {
            iVar13 = iVar13 + (int)lVar32 *
                              (int)objects[*(int *)((long)&pvVar21->typ + lVar23)].oc_cost;
            u.urscore = iVar13;
          }
          lVar23 = lVar23 + 0x10;
        } while ((long)pvVar17->size * 0x10 != lVar23);
      }
      pvVar21 = pvVar17[1].list;
      pvVar17 = pvVar17 + 1;
    } while (pvVar21 != (valuable_data *)0x0);
    artifact_score(invent,'\x01',&menu);
    keepdogs(1,(char *)0x0);
    **viz_array = **viz_array | 2;
    mtmp = mydogs;
    if (program_state.stopprint == 0) {
      builtin_strncpy(pbuf,"You",4);
    }
    iVar13 = program_state.stopprint;
    if (mtmp == (monst *)0x0) {
      if (program_state.stopprint == 0) {
        sVar15 = strlen(pbuf);
        (pbuf + sVar15)[0] = ' ';
        (pbuf + sVar15)[1] = '\0';
        goto LAB_00195fab;
      }
    }
    else {
      do {
        if (iVar13 == 0) {
          pcVar16 = eos(pbuf);
          pcVar18 = mon_nam(mtmp);
          sprintf(pcVar16," and %s",pcVar18);
          iVar13 = program_state.stopprint;
        }
        if (mtmp->mtame != '\0') {
          u.urscore = u.urscore + mtmp->mhp;
        }
        mtmp = mtmp->nmon;
      } while (mtmp != (monst *)0x0);
      if (iVar13 == 0) {
        lVar23 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pbuf);
        menu.icount = menu.icount + 1;
      }
      *pbuf = '\0';
LAB_00195fab:
      if (program_state.stopprint == 0) {
        pcVar16 = eos(pbuf);
        pcVar18 = "escaped from the dungeon";
        if (how == 0x10) {
          pcVar18 = "defied the gods and escaped";
        }
        pcVar27 = "went to your reward";
        if (how != 0x11) {
          pcVar27 = pcVar18;
        }
        pcVar18 = "s";
        if (u.urscore == 1) {
          pcVar18 = "";
        }
        sprintf(pcVar16,"%s with %d point%s,",pcVar27,(ulong)(uint)u.urscore,pcVar18);
        lVar23 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pbuf);
        menu.icount = menu.icount + 1;
        if (program_state.stopprint == 0) {
          artifact_score(invent,'\0',&menu);
        }
      }
    }
    pvVar17 = valuables;
    pvVar21 = gems;
    do {
      iVar14 = pvVar17->size;
      uVar26 = (ulong)iVar14;
      if (1 < (long)uVar26) {
        uVar19 = 1;
        do {
          lVar23 = pvVar21[uVar19].count;
          if (lVar23 != 0) {
            iVar13 = pvVar21[uVar19].typ;
            uVar6 = *(undefined4 *)&pvVar21[uVar19].field_0xc;
            uVar25 = uVar19 & 0xffffffff;
            do {
              iVar24 = (int)uVar25;
              if (lVar23 <= pvVar21[uVar25 - 1].count) goto LAB_00196152;
              pvVar2 = pvVar21 + uVar25;
              iVar4 = pvVar21[uVar25 - 1].typ;
              uVar5 = *(undefined4 *)&pvVar21[uVar25 - 1].field_0xc;
              pvVar2->count = pvVar21[uVar25 - 1].count;
              pvVar2->typ = iVar4;
              *(undefined4 *)&pvVar2->field_0xc = uVar5;
              uVar25 = (ulong)(iVar24 - 1);
            } while (1 < iVar24);
            iVar24 = 0;
LAB_00196152:
            pvVar21[iVar24].count = lVar23;
            pvVar21[iVar24].typ = iVar13;
            *(undefined4 *)&pvVar21[iVar24].field_0xc = uVar6;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar26);
      }
      iVar13 = program_state.stopprint;
      if (program_state.stopprint == 0 && 0 < iVar14) {
        piVar28 = &pvVar21->typ;
        iVar13 = 0;
        uVar19 = 1;
        do {
          lVar23 = ((valuable_data *)(piVar28 + -2))->count;
          if (lVar23 == 0) {
            bVar29 = true;
          }
          else {
            iVar13 = *piVar28;
            if (iVar13 < 0x206 || objects[iVar13].oc_class != '\r') {
              poVar20 = mksobj(level,iVar13,'\0','\0');
              discover_object((int)poVar20->otyp,'\x01','\x01');
              poVar20->field_0x4a = poVar20->field_0x4a | 0x30;
              poVar20->onamelth = '\0';
              poVar20->quan = (int)lVar23;
              pcVar16 = xname(poVar20);
              sVar3 = objects[iVar13].oc_cost;
              pcVar18 = currency(2);
              sprintf(pbuf,"%8ld %s (worth %ld %s),",lVar23,pcVar16,sVar3 * lVar23,pcVar18);
              obfree(poVar20,(obj *)0x0);
            }
            else {
              pcVar16 = "s";
              if (lVar23 == 1) {
                pcVar16 = "";
              }
              sprintf(pbuf,"%8ld worthless piece%s of colored glass,",lVar23,pcVar16);
            }
            lVar23 = (long)menu.size;
            if (menu.size <= menu.icount) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
            }
            pnVar1 = menu.items + menu.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_TEXT;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,pbuf);
            menu.icount = menu.icount + 1;
            bVar29 = program_state.stopprint == 0;
            iVar13 = program_state.stopprint;
          }
          if (uVar26 <= uVar19) break;
          piVar28 = piVar28 + 4;
          uVar19 = uVar19 + 1;
        } while (bVar29);
      }
      pvVar21 = pvVar17[1].list;
      pvVar17 = pvVar17 + 1;
    } while (pvVar21 != (valuable_data *)0x0);
  }
  else {
    if (program_state.stopprint != 0) goto LAB_0019671a;
    lVar23 = (long)u.uz.dnum;
    if (u.uz.dlevel < '\x01' && lVar23 == 0) {
      if (u.uz.dlevel < '\0') {
        pcVar16 = "passed away";
      }
      else {
        pcVar16 = ends[how];
      }
      sprintf(pbuf,"You %s beyond the confines of the dungeon",pcVar16);
    }
    else {
      bVar11 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      pdVar22 = (dungeon *)"The Astral Plane";
      if (bVar11 == '\0') {
        pdVar22 = dungeons + lVar23;
      }
      sprintf(pbuf,"You %s in %s",ends[how],pdVar22);
      if ((u.uz.dnum != dungeon_topology.d_astral_level.dnum) &&
         (bVar11 = on_level(&u.uz,&dungeon_topology.d_knox_level), bVar11 == '\0')) {
        pcVar16 = eos(pbuf);
        bVar11 = In_quest(&u.uz);
        if (bVar11 == '\0') {
          cVar12 = depth(&u.uz);
        }
        else {
          cVar12 = dunlev(&u.uz);
        }
        sprintf(pcVar16," on dungeon level %d",(ulong)(uint)(int)cVar12);
      }
    }
    pcVar16 = eos(pbuf);
    pcVar18 = "s";
    if (u.urscore == 1) {
      pcVar18 = "";
    }
    sprintf(pcVar16," with %d point%s,",(ulong)(uint)u.urscore,pcVar18);
    lVar23 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    iVar13 = program_state.stopprint;
  }
  if (iVar13 == 0) {
    pcVar18 = "s";
    pcVar16 = "s";
    if (umoney == 1) {
      pcVar16 = "";
    }
    pcVar27 = "s";
    if (moves == 1) {
      pcVar27 = "";
    }
    sprintf(pbuf,"and %ld piece%s of gold, after %u move%s.",umoney,pcVar16,(ulong)moves,pcVar27);
    lVar23 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    if (program_state.stopprint == 0) {
      if (u.uhpmax == 1) {
        pcVar18 = "";
      }
      sprintf(pbuf,"You were level %d with a maximum of %d hit point%s when you %s.",
              (ulong)(uint)u.ulevel,(ulong)(uint)u.uhpmax,pcVar18,ends[how]);
      lVar23 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pbuf);
      menu.icount = menu.icount + 1;
      lVar23 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar23 * 0x218);
      }
      pnVar1 = menu.items;
      lVar23 = (long)menu.icount;
      menu.items[lVar23].accel = '\0';
      menu.items[lVar23].group_accel = '\0';
      menu.items[lVar23].selected = '\0';
      menu.items[lVar23].caption[0] = '\0';
      menu.items[lVar23].id = 0;
      p_Var10 = windowprocs.win_outrip;
      menu.items[lVar23].role = MI_TEXT;
      iVar13 = menu.icount + 1;
      menu.icount = iVar13;
      if (program_state.stopprint == 0) {
        iVar14 = getyear();
        (*p_Var10)(pnVar1,iVar13,how < 0xc,plname,(int)umoney,outrip_buf,how,iVar14);
      }
    }
  }
LAB_0019671a:
  free(menu.items);
  program_state.stopprint = iVar9;
  return;
}

Assistant:

void display_rip(int how, char *kilbuf, char *pbuf, long umoney)
{
	char outrip_buf[BUFSZ];
	boolean show_endwin = FALSE;
	struct menulist menu;
	int saved_stopprint = done_stopprint;

	/* always show this under normal circumstances */
	done_stopprint = 0;

	init_menulist(&menu);

	/* clean up unneeded windows */
	if (program_state.game_running) {
	    win_pause_output(P_MESSAGE);

	    if (!done_stopprint || flags.tombstone)
		show_endwin = TRUE;

	    if ((how <= GENOCIDED || how == DISINTEGRATED) &&
		flags.tombstone && show_endwin) {
		/* Put together death description */
		switch (killer_format) {
		    default: warning("bad killer format?");
		    case KILLED_BY_AN:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, an(killer));
			break;
		    case KILLED_BY:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, killer);
			break;
		    case NO_KILLER_PREFIX:
			strcpy(outrip_buf, killer);
			break;
		}
	    }
	} else {
	    done_stopprint = 1;
	}

/* changing kilbuf really changes killer. we do it this way because
   killer is declared a (const char *)
*/
	if (u.uhave.amulet) strcat(kilbuf, " (with the Amulet)");
	else if (how == ESCAPED) {
	    if (Is_astralevel(&u.uz))	/* offered Amulet to wrong deity */
		strcat(kilbuf, " (in celestial disgrace)");
	    else if (carrying(FAKE_AMULET_OF_YENDOR))
		strcat(kilbuf, " (with a fake Amulet)");
		/* don't bother counting to see whether it should be plural */
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "%s %s the %s...", Goodbye(), plname,
		   how != ASCENDED ?
		      (const char *) ((flags.female && urole.name.f) ?
		         urole.name.f : urole.name.m) :
		      (const char *) (flags.female ? "Demigoddess" : "Demigod"));
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}

	if (how == ESCAPED || how == DEFIED || how == ASCENDED) {
	    struct monst *mtmp;
	    struct obj *otmp;
	    const struct val_list *val;
	    int i;

	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++) {
		    val->list[i].count = 0L;
		}
	    get_valuables(invent);

	    /* add points for collected valuables */
	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++)
		    if (val->list[i].count != 0L)
			u.urscore += val->list[i].count
				  * (long)objects[val->list[i].typ].oc_cost;

	    /* count the points for artifacts */
	    artifact_score(invent, TRUE, &menu);

	    keepdogs(1, NULL);	/* only pets follow you */
	    viz_array[0][0] |= IN_SIGHT; /* need visibility for naming */
	    mtmp = mydogs;
	    if (!done_stopprint) strcpy(pbuf, "You");
	    if (mtmp) {
		while (mtmp) {
		    if (!done_stopprint)
			sprintf(eos(pbuf), " and %s", mon_nam(mtmp));
		    if (mtmp->mtame)
			u.urscore += mtmp->mhp;
		    mtmp = mtmp->nmon;
		}
		if (!done_stopprint) add_menutext(&menu, pbuf);
		pbuf[0] = '\0';
	    } else {
		if (!done_stopprint) strcat(pbuf, " ");
	    }
	    if (!done_stopprint) {
		sprintf(eos(pbuf), "%s with %d point%s,",
			how==ASCENDED ? "went to your reward" :
			how==DEFIED   ? "defied the gods and escaped" :
					"escaped from the dungeon",
			u.urscore, plur(u.urscore));
		add_menutext(&menu, pbuf);
	    }

	    if (!done_stopprint)
		artifact_score(invent, FALSE, &menu);	/* list artifacts */

	    /* list valuables here */
	    for (val = valuables; val->list; val++) {
		sort_valuables(val->list, val->size);
		for (i = 0; i < val->size && !done_stopprint; i++) {
		    int typ = val->list[i].typ;
		    long count = val->list[i].count;

		    if (count == 0L) continue;
		    if (objects[typ].oc_class != GEM_CLASS || typ <= LAST_GEM) {
			otmp = mksobj(level, typ, FALSE, FALSE);
			makeknown(otmp->otyp);
			otmp->known = 1;	/* for fake amulets */
			otmp->dknown = 1;	/* seen it (blindness fix) */
			otmp->onamelth = 0;
			otmp->quan = count;
			sprintf(pbuf, "%8ld %s (worth %ld %s),",
				count, xname(otmp),
				count * (long)objects[typ].oc_cost, currency(2L));
			obfree(otmp, NULL);
		    } else {
			sprintf(pbuf,
				"%8ld worthless piece%s of colored glass,",
				count, plur(count));
		    }
		    add_menutext(&menu, pbuf);
		}
	    }

	} else if (!done_stopprint) {
	    /* did not escape or ascend */
	    if (u.uz.dnum == 0 && u.uz.dlevel <= 0) {
		/* level teleported out of the dungeon; `how' is DIED,
		   due to falling or to "arriving at heaven prematurely" */
		sprintf(pbuf, "You %s beyond the confines of the dungeon",
			(u.uz.dlevel < 0) ? "passed away" : ends[how]);
	    } else {
		/* more conventional demise */
		const char *where = dungeons[u.uz.dnum].dname;

		if (Is_astralevel(&u.uz)) where = "The Astral Plane";
		sprintf(pbuf, "You %s in %s", ends[how], where);
		if (!In_endgame(&u.uz) && !Is_knox(&u.uz))
		    sprintf(eos(pbuf), " on dungeon level %d",
			    In_quest(&u.uz) ? dunlev(&u.uz) : depth(&u.uz));
	    }

	    sprintf(eos(pbuf), " with %d point%s,",
		    u.urscore, plur(u.urscore));
	    add_menutext(&menu, pbuf);
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "and %ld piece%s of gold, after %u move%s.",
		    umoney, plur(umoney), moves, plur(moves));
	    add_menutext(&menu, pbuf);
	}
	if (!done_stopprint) {
	    sprintf(pbuf,
	     "You were level %d with a maximum of %d hit point%s when you %s.",
		    u.ulevel, u.uhpmax, plur(u.uhpmax), ends[how]);
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}
	if (!done_stopprint)
	    outrip(menu.items, menu.icount,
		   (how <= GENOCIDED || how == DISINTEGRATED), plname, umoney,
		   outrip_buf, how, getyear());

	free(menu.items);

	done_stopprint = saved_stopprint;
}